

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format.cc
# Opt level: O1

size_t google::protobuf::internal::ComputeUnknownFieldsSize
                 (InternalMetadataWithArena *metadata,size_t total_size,CachedSize *cached_size)

{
  void *pvVar1;
  UnknownFieldSet *unknown_fields;
  size_t sVar2;
  
  pvVar1 = (metadata->
           super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
           ).ptr_;
  if (((ulong)pvVar1 & 1) == 0) {
    unknown_fields = UnknownFieldSet::default_instance();
  }
  else {
    unknown_fields = (UnknownFieldSet *)((ulong)pvVar1 & 0xfffffffffffffffe);
  }
  sVar2 = WireFormat::ComputeUnknownFieldsSize(unknown_fields);
  (cached_size->size_).super___atomic_base<int>._M_i = (__int_type_conflict)(sVar2 + total_size);
  return sVar2 + total_size;
}

Assistant:

size_t ComputeUnknownFieldsSize(const InternalMetadataWithArena& metadata,
                                size_t total_size, CachedSize* cached_size) {
  total_size += WireFormat::ComputeUnknownFieldsSize(metadata.unknown_fields());
  cached_size->Set(ToCachedSize(total_size));
  return total_size;
}